

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O3

void __thiscall
QGraphicsTextItem::mouseDoubleClickEvent(QGraphicsTextItem *this,QGraphicsSceneMouseEvent *event)

{
  QGraphicsItem *this_00;
  int iVar1;
  QWidgetTextControl *this_01;
  bool bVar2;
  long in_FS_OFFSET;
  double in_XMM1_Qa;
  QPointF local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QGraphicsItem *)(this + 0x10);
  if (*(char *)(*(long *)(this + 0x20) + 0x2c) != '\x01') {
    bVar2 = QGraphicsItem::hasFocus(this_00);
    if (bVar2) {
      this_01 = (QWidgetTextControl *)**(undefined8 **)(this + 0x20);
      if (this_01 != (QWidgetTextControl *)0x0) {
        iVar1 = *(int *)(*(undefined8 **)(this + 0x20) + 5);
        QWidgetTextControl::document(this_01);
        QTextDocument::pageSize();
        local_30.yp = in_XMM1_Qa * (double)iVar1;
        local_30.xp = 0.0;
        QWidgetTextControl::processEvent(this_01,(QEvent *)event,&local_30,(QWidget *)0x0);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        return;
      }
      goto LAB_005e7cfb;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    (*this_00->_vptr_QGraphicsItem[0x1a])(this_00,event);
    return;
  }
LAB_005e7cfb:
  __stack_chk_fail();
}

Assistant:

void QGraphicsTextItem::mouseDoubleClickEvent(QGraphicsSceneMouseEvent *event)
{
    if (dd->useDefaultImpl) {
        QGraphicsItem::mouseDoubleClickEvent(event);
        return;
    }

    if (!hasFocus()) {
        QGraphicsItem::mouseDoubleClickEvent(event);
        return;
    }

    dd->sendControlEvent(event);
}